

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O2

void __thiscall
FunctionTable::SetTermBottomLabel(FunctionTable *this,string *func_name,string *bottom_label)

{
  __type _Var1;
  pointer pFVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  for (pFVar2 = (this->m_func_table).
                super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>._M_impl.
                super__Vector_impl_data._M_start;
      pFVar2 != (this->m_func_table).
                super__Vector_base<FunctionTableTerm,_std::allocator<FunctionTableTerm>_>._M_impl.
                super__Vector_impl_data._M_finish; pFVar2 = pFVar2 + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)pFVar2);
    _Var1 = std::operator==(&local_50,func_name);
    std::__cxx11::string::~string((string *)&local_50);
    if (_Var1) {
      std::__cxx11::string::_M_assign((string *)&pFVar2->m_bottom_label);
    }
  }
  return;
}

Assistant:

void FunctionTable::SetTermBottomLabel(const string& func_name, const string& bottom_label) {
    auto iter = m_func_table.begin();
    for (; iter != m_func_table.end(); ++iter) {
        if (iter->GetName() == func_name) {
            iter->SetBottomLabel(bottom_label);
        }
    }
}